

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O2

int32_t intersect_vector16_inplace(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 local_58 [32];
  
  uVar8 = s_a & 0xfffffffffffffff8;
  uVar12 = s_b & 0xfffffffffffffff8;
  if (uVar8 == 0 || uVar12 == 0) {
    uVar11 = 0;
    uVar9 = 0;
    lVar7 = 0;
    goto LAB_0010acd2;
  }
  auVar3 = vlddqu_avx(*(undefined1 (*) [16])A);
  auVar15 = ZEXT1664(auVar3);
  auVar3 = vlddqu_avx(*(undefined1 (*) [16])B);
  auVar14 = ZEXT1664(auVar3);
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  local_58 = auVar13._0_32_;
  lVar6 = 0;
  uVar10 = 0;
  uVar9 = 0;
  lVar7 = 0;
  while ((A[uVar9] == 0 || (B[uVar10] == 0))) {
    vpcmpestrm_avx(auVar14._0_16_,auVar15._0_16_,1);
    auVar3 = vpshufb_avx(auVar15._0_16_,
                         *(undefined1 (*) [16])(shuffle_mask16 + (long)auVar13._0_4_ * 0x10));
    *(undefined1 (*) [16])(local_58 + lVar6 * 2) = auVar3;
    lVar6 = lVar6 + (ulong)(uint)POPCOUNT(auVar13._0_4_);
    uVar2 = A[uVar9 + 7];
    uVar1 = B[uVar10 + 7];
    if (uVar2 <= uVar1) {
      uVar9 = uVar9 + 8;
      auVar3 = local_58._0_16_;
      *(undefined1 (*) [16])(A + lVar7) = local_58._0_16_;
      local_58._0_16_ = ZEXT816(0);
      lVar7 = lVar7 + lVar6;
      if (uVar9 == uVar8) goto LAB_0010aca9;
      auVar4 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar9));
      auVar15 = ZEXT1664(auVar4);
      lVar6 = 0;
    }
    auVar13 = ZEXT1664(auVar3);
    if (uVar1 <= uVar2) {
      uVar10 = uVar10 + 8;
      uVar11 = uVar12;
      if (uVar10 == uVar12) goto LAB_0010acb3;
      auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar10));
      auVar14 = ZEXT1664(auVar3);
    }
  }
  uVar11 = uVar10;
  if (uVar10 < uVar12 && uVar9 < uVar8) {
    while( true ) {
      uVar2 = B[uVar10 + 7];
      do {
        vpcmpistrm_avx(auVar14._0_16_,auVar15._0_16_,1);
        auVar3 = vpshufb_avx(auVar15._0_16_,
                             *(undefined1 (*) [16])(shuffle_mask16 + (long)auVar13._0_4_ * 0x10));
        *(undefined1 (*) [16])(local_58 + lVar6 * 2) = auVar3;
        lVar6 = (ulong)(uint)POPCOUNT(auVar13._0_4_) + lVar6;
        uVar1 = A[uVar9 + 7];
        if (uVar1 <= uVar2) {
          uVar9 = uVar9 + 8;
          auVar3 = local_58._0_16_;
          *(undefined1 (*) [16])(A + lVar7) = local_58._0_16_;
          local_58._0_16_ = ZEXT416(0) << 0x40;
          lVar7 = lVar7 + lVar6;
          if (uVar9 == uVar8) goto LAB_0010aca9;
          auVar4 = vlddqu_avx(*(undefined1 (*) [16])(A + uVar9));
          auVar15 = ZEXT1664(auVar4);
          lVar6 = 0;
        }
        auVar13 = ZEXT1664(auVar3);
      } while (uVar1 < uVar2);
      uVar10 = uVar10 + 8;
      uVar11 = uVar12;
      if (uVar10 == uVar12) break;
      auVar3 = vlddqu_avx(*(undefined1 (*) [16])(B + uVar10));
      auVar14 = ZEXT1664(auVar3);
    }
  }
  goto LAB_0010acb3;
LAB_0010aca9:
  lVar6 = 0;
  uVar9 = uVar8;
  uVar11 = uVar10;
LAB_0010acb3:
  for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
    A[lVar7 + lVar5] = *(uint16_t *)(local_58 + lVar5 * 2);
  }
  uVar9 = uVar9 + lVar6;
  lVar7 = lVar7 + lVar5;
LAB_0010acd2:
  while ((uVar9 < s_a && (uVar11 < s_b))) {
    uVar2 = A[uVar9];
    if (uVar2 < B[uVar11]) {
      uVar9 = uVar9 + 1;
    }
    else {
      if (uVar2 <= B[uVar11]) {
        A[lVar7] = uVar2;
        lVar7 = lVar7 + 1;
        uVar9 = uVar9 + 1;
      }
      uVar11 = uVar11 + 1;
    }
  }
  return (int32_t)lVar7;
}

Assistant:

int32_t intersect_vector16_inplace(uint16_t *__restrict__ A, size_t s_a,
                                   const uint16_t *__restrict__ B, size_t s_b) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        __m128i tmp[2] = {_mm_setzero_si128()};
        size_t tmp_count = 0;
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&((uint16_t *)tmp)[tmp_count], p);
            tmp_count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                _mm_storeu_si128((__m128i *)&A[count], tmp[0]);
                _mm_storeu_si128(tmp, _mm_setzero_si128());
                count += tmp_count;
                tmp_count = 0;
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b)) {
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                __m128i sm16 =
                    _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&((uint16_t *)tmp)[tmp_count], p);
                tmp_count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    _mm_storeu_si128((__m128i *)&A[count], tmp[0]);
                    _mm_storeu_si128(tmp, _mm_setzero_si128());
                    count += tmp_count;
                    tmp_count = 0;
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
        }
        // tmp_count <= 8, so this does not affect efficiency so much
        for (size_t i = 0; i < tmp_count; i++) {
            A[count] = ((uint16_t *)tmp)[i];
            count++;
        }
        i_a += tmp_count;  // We can at least jump pass $tmp_count elements in A
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            A[count] = a;  //==b;
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}